

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

Lattice * __thiscall MeCab::anon_unknown_0::ModelImpl::createLattice(ModelImpl *this)

{
  bool bVar1;
  long in_RDI;
  Writer *in_stack_00000018;
  LatticeImpl *in_stack_00000020;
  ModelImpl *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  bVar1 = is_available(in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_8 = (Lattice *)operator_new(0xd8);
    scoped_ptr<MeCab::Writer>::get((scoped_ptr<MeCab::Writer> *)(in_RDI + 0x10));
    LatticeImpl::LatticeImpl(in_stack_00000020,in_stack_00000018);
  }
  else {
    setGlobalError((char *)0x148d98);
    local_8 = (Lattice *)0x0;
  }
  return local_8;
}

Assistant:

Lattice *ModelImpl::createLattice() const {
  if (!is_available()) {
    setGlobalError("Model is not available");
    return 0;
  }
  return new LatticeImpl(writer_.get());
}